

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

ostream * Fixpp::details::
          FieldWriter<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<711u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::Strin...pp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>>>
          ::
          write<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<711u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::String>,Fix___pp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>>>
                    (ostream *os,Field<_b8373603_> *field)

{
  void *pvVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  InstanceGroup<_b8373603_> *instance;
  void *pvVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  uStack_28 = CONCAT17(0x7c,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 7),1);
  pvVar1 = (field->val_).super_SmallVectorImpl<_a3d882d6_>.super_SmallVectorTemplateBase<_3b957e65_>
           .super_SmallVectorTemplateCommon<_5cca3c12_>.super_SmallVectorBase.EndX;
  for (pvVar3 = (field->val_).super_SmallVectorImpl<_a3d882d6_>.
                super_SmallVectorTemplateBase<_3b957e65_>.
                super_SmallVectorTemplateCommon<_5cca3c12_>.super_SmallVectorBase.BeginX;
      pvVar3 != pvVar1; pvVar3 = (void *)((long)pvVar3 + 0x2268)) {
    FieldWriter<$e636abe6$>::doWriteGroupFields<_615b6871_>(os,pvVar3);
  }
  return os;
}

Assistant:

static std::ostream& write(std::ostream& os, const FieldT& field)
        {
            os << GroupTag::Id << "=" << field.size() << SOH;

            static constexpr size_t GroupSize = FieldT::TotalTags;

            const auto& group = field.get();
            for (const auto& instance: group)
            {
                doWriteGroupFields(os, instance, meta::seq::make_index_sequence<GroupSize>{});
            }

            return os;
        }